

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void rectangle(double x,double y,double x2,double y2,Fl_Color col)

{
  Fl_Color col_local;
  double y2_local;
  double x2_local;
  double y_local;
  double x_local;
  
  fl_color(col);
  fl_begin_polygon();
  fl_vertex(x,y);
  fl_vertex(x2,y);
  fl_vertex(x2,y2);
  fl_vertex(x,y2);
  fl_end_polygon();
  set_outline_color(col);
  fl_begin_loop();
  fl_vertex(x,y);
  fl_vertex(x2,y);
  fl_vertex(x2,y2);
  fl_vertex(x,y2);
  fl_end_loop();
  return;
}

Assistant:

static void rectangle(double x,double y,double x2,double y2,Fl_Color col) {
  fl_color(col);
  BP; vv(x,y); vv(x2,y); vv(x2,y2); vv(x,y2); EP;
  set_outline_color(col);
  BC; vv(x,y); vv(x2,y); vv(x2,y2); vv(x,y2); EC;
}